

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O0

bool __thiscall
Diligent::DearchiverBase::PSOData<Diligent::RayTracingPipelineStateCreateInfo>::DeserializeInternal
          (PSOData<Diligent::RayTracingPipelineStateCreateInfo> *this,
          Serializer<(Diligent::SerializerMode)0> *Ser)

{
  bool bVar1;
  function<void_(unsigned_int_&,_Diligent::IShader_*&)> local_40;
  anon_class_1_0_00000001 local_19;
  Serializer<(Diligent::SerializerMode)0> *pSStack_18;
  anon_class_1_0_00000001 RemapShaders;
  Serializer<(Diligent::SerializerMode)0> *Ser_local;
  PSOData<Diligent::RayTracingPipelineStateCreateInfo> *this_local;
  
  pSStack_18 = Ser;
  std::function<void(unsigned_int&,Diligent::IShader*&)>::
  function<Diligent::DearchiverBase::PSOData<Diligent::RayTracingPipelineStateCreateInfo>::DeserializeInternal(Diligent::Serializer<(Diligent::SerializerMode)0>&)::__0&,void>
            ((function<void(unsigned_int&,Diligent::IShader*&)> *)&local_40,&local_19);
  bVar1 = PSOSerializer<(Diligent::SerializerMode)0>::SerializeCreateInfo
                    (Ser,&this->CreateInfo,&this->PRSNames,&this->Allocator,&local_40);
  std::function<void_(unsigned_int_&,_Diligent::IShader_*&)>::~function(&local_40);
  return bVar1;
}

Assistant:

bool DearchiverBase::PSOData<RayTracingPipelineStateCreateInfo>::DeserializeInternal(Serializer<SerializerMode::Read>& Ser)
{
    auto RemapShaders = [](Uint32& InIndex, IShader*& outShader) {
        outShader = BitCast<IShader*>(size_t{InIndex});
    };
    return PSOSerializer<SerializerMode::Read>::SerializeCreateInfo(Ser, CreateInfo, PRSNames, &Allocator, RemapShaders);
}